

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O1

void helper_crypto_sm3tt_arm(void *vd,void *vn,void *vm,uint32_t imm2,uint32_t opcode)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CRYPTO_STATE m;
  undefined8 local_10;
  undefined8 local_8;
  
  uVar1 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  local_10 = *vm;
  local_8 = *(undefined8 *)((long)vm + 8);
  if (3 < imm2) {
    __assert_fail("imm2 < 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                  ,0x237,"void helper_crypto_sm3tt_arm(void *, void *, void *, uint32_t, uint32_t)")
    ;
  }
  uVar7 = (uint)uVar2;
  uVar5 = (uint)(uVar2 >> 0x20);
  uVar4 = (uint)(uVar1 >> 0x20);
  if ((opcode & 0xfffffffd) == 0) {
    uVar4 = uVar5 ^ uVar4;
    uVar6 = uVar7;
  }
  else {
    if (opcode != 3) {
      if (opcode != 1) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/crypto_helper.c"
                   ,0x243,(char *)0x0);
      }
      uVar6 = (uVar5 | uVar7) & uVar4 | uVar5 & uVar7;
      goto LAB_005819b4;
    }
    uVar6 = uVar5 & (uVar4 ^ uVar7);
  }
  uVar6 = uVar6 ^ uVar4;
LAB_005819b4:
  iVar3 = (int)uVar1 + uVar6 + *(int *)((long)&local_10 + (ulong)imm2 * 4);
  uVar4 = (uint)((ulong)*(undefined8 *)((long)vn + 8) >> 0x20);
  if (opcode < 2) {
    uVar4 = iVar3 + ((uVar5 << 0xc | uVar5 >> 0x14) ^ uVar4);
    uVar7 = uVar7 << 9 | uVar7 >> 0x17;
  }
  else {
    uVar4 = iVar3 + uVar4;
    uVar4 = uVar4 ^ (uVar4 * 0x20000 | uVar4 >> 0xf) ^ (uVar4 * 0x200 | uVar4 >> 0x17);
    uVar7 = uVar7 << 0x13 | uVar7 >> 0xd;
  }
  *(ulong *)vd = (ulong)uVar7 << 0x20 | uVar1 >> 0x20;
  *(ulong *)((long)vd + 8) = (ulong)uVar4 << 0x20 | uVar2 >> 0x20;
  return;
}

Assistant:

void HELPER(crypto_sm3tt)(void *vd, void *vn, void *vm, uint32_t imm2,
                          uint32_t opcode)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    uint32_t t = 0;

    assert(imm2 < 4);

    if (opcode == 0 || opcode == 2) {
        /* SM3TT1A, SM3TT2A */
        t = par(CR_ST_WORD(d, 3), CR_ST_WORD(d, 2), CR_ST_WORD(d, 1));
    } else if (opcode == 1) {
        /* SM3TT1B */
        t = maj(CR_ST_WORD(d, 3), CR_ST_WORD(d, 2), CR_ST_WORD(d, 1));
    } else if (opcode == 3) {
        /* SM3TT2B */
        t = cho(CR_ST_WORD(d, 3), CR_ST_WORD(d, 2), CR_ST_WORD(d, 1));
    } else {
        g_assert_not_reached();
    }

    t += CR_ST_WORD(d, 0) + CR_ST_WORD(m, imm2);

    CR_ST_WORD(d, 0) = CR_ST_WORD(d, 1);

    if (opcode < 2) {
        /* SM3TT1A, SM3TT1B */
        t += CR_ST_WORD(n, 3) ^ ror32(CR_ST_WORD(d, 3), 20);

        CR_ST_WORD(d, 1) = ror32(CR_ST_WORD(d, 2), 23);
    } else {
        /* SM3TT2A, SM3TT2B */
        t += CR_ST_WORD(n, 3);
        t ^= rol32(t, 9) ^ rol32(t, 17);

        CR_ST_WORD(d, 1) = ror32(CR_ST_WORD(d, 2), 13);
    }

    CR_ST_WORD(d, 2) = CR_ST_WORD(d, 3);
    CR_ST_WORD(d, 3) = t;

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}